

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

void event_base_active_by_fd(event_base *base,int fd,short events)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  event *peVar4;
  long lVar5;
  
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if ((events & 1U) == 0) {
    evmap_io_active_(base,fd,events & 0x86);
  }
  else {
    uVar1 = (base->timeheap).n;
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        peVar4 = (base->timeheap).p[uVar3];
        if (peVar4->ev_fd == fd) {
          event_active_nolock_(peVar4,1,1);
          uVar1 = (base->timeheap).n;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar1);
    }
    iVar2 = base->n_common_timeouts;
    if (0 < iVar2) {
      lVar5 = 0;
      do {
        peVar4 = (base->common_timeout_queues[lVar5]->events).tqh_first;
        if (peVar4 != (event *)0x0) {
          do {
            if (peVar4->ev_fd == fd) {
              event_active_nolock_(peVar4,1,1);
            }
            peVar4 = (peVar4->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
          } while (peVar4 != (event *)0x0);
          iVar2 = base->n_common_timeouts;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar2);
    }
  }
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
    return;
  }
  return;
}

Assistant:

void
event_base_active_by_fd(struct event_base *base, evutil_socket_t fd, short events)
{
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	/* Activate any non timer events */
	if (!(events & EV_TIMEOUT)) {
		evmap_io_active_(base, fd, events & (EV_READ|EV_WRITE|EV_CLOSED));
	} else {
		/* If we want to activate timer events, loop and activate each event with
		 * the same fd in both the timeheap and common timeouts list */
		int i;
		unsigned u;
		struct event *ev;

		for (u = 0; u < base->timeheap.n; ++u) {
			ev = base->timeheap.p[u];
			if (ev->ev_fd == fd) {
				event_active_nolock_(ev, EV_TIMEOUT, 1);
			}
		}

		for (i = 0; i < base->n_common_timeouts; ++i) {
			struct common_timeout_list *ctl = base->common_timeout_queues[i];
			TAILQ_FOREACH(ev, &ctl->events,
				ev_timeout_pos.ev_next_with_common_timeout) {
				if (ev->ev_fd == fd) {
					event_active_nolock_(ev, EV_TIMEOUT, 1);
				}
			}
		}
	}

	EVBASE_RELEASE_LOCK(base, th_base_lock);
}